

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O0

UStringStream * __thiscall jsonnet::internal::UStringStream::operator<<(UStringStream *this,uint c)

{
  bool bVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  reference pcVar2;
  uint in_ESI;
  UStringStream *in_RDI;
  char c_1;
  iterator __end3;
  iterator __begin3;
  __string_type *__range3;
  stringstream ss;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe08;
  char32_t in_stack_fffffffffffffe1c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  string local_1d0 [32];
  string *local_1b0;
  stringstream local_198 [16];
  undefined1 local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::ostream::operator<<(local_188,local_c);
  std::__cxx11::stringstream::str();
  local_1b0 = local_1d0;
  local_1d8._M_current = (char *)std::__cxx11::string::begin();
  this_00 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
            std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_RDI,in_stack_fffffffffffffe08);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_1d8);
    in_stack_fffffffffffffe1c = CONCAT13(*pcVar2,(int3)in_stack_fffffffffffffe1c);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(this_00,in_stack_fffffffffffffe1c);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_1d8);
  }
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

UStringStream &operator<<(T c)
    {
        std::stringstream ss;
        ss << c;
        for (char c : ss.str())
            buf.push_back(char32_t(c));
        return *this;
    }